

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scpserver.c
# Opt level: O0

void scp_error_send_message_cb(void *vscp)

{
  SshChannel *c;
  void *data;
  size_t len;
  ScpError *scp;
  void *vscp_local;
  
  c = *vscp;
  data = *(void **)((long)vscp + 8);
  len = strlen(*(char **)((long)vscp + 8));
  sshfwd_write_ext(c,true,data,len);
  sshfwd_write_ext(*vscp,true,"\n",1);
  sshfwd_send_exit_status(*vscp,1);
  sshfwd_write_eof(*vscp);
  sshfwd_initiate_close(*vscp,*(char **)((long)vscp + 8));
  return;
}

Assistant:

static void scp_error_send_message_cb(void *vscp)
{
    ScpError *scp = (ScpError *)vscp;
    sshfwd_write_ext(scp->sc, true, scp->message, strlen(scp->message));
    sshfwd_write_ext(scp->sc, true, "\n", 1);
    sshfwd_send_exit_status(scp->sc, 1);
    sshfwd_write_eof(scp->sc);
    sshfwd_initiate_close(scp->sc, scp->message);
}